

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall van_kampen::Node::printSelf(Node *this,ostream *os,graphOutputFormat fmt)

{
  char *__rhs;
  string label;
  string comment;
  string shape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (fmt == DOT) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"shape=",(allocator<char> *)&local_70);
    __rhs = "point";
    if (this->isHighlighted_ != false) {
      __rhs = "circle";
    }
    std::operator+(&local_30,&local_90,__rhs);
    std::__cxx11::string::~string((string *)&local_90);
    if ((this->label_)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"",(allocator<char> *)&local_70);
    }
    else {
      std::operator+(&local_90,",label=",&this->label_);
    }
    if ((this->comment_)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"",(allocator<char> *)&local_50);
    }
    else {
      std::operator+(&local_50,",xlabel=\"",&this->comment_);
      std::operator+(&local_70,&local_50,"\"");
      std::__cxx11::string::~string((string *)&local_50);
    }
    utility::
    print<int_const&,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[4]>
              (os,&this->id_,(char (*) [2])"[",&local_30,&local_90,&local_70,(char (*) [4])"];\n");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void Node::printSelf(std::ostream &os, graphOutputFormat fmt) const
{
    switch (fmt)
    {
    case graphOutputFormat::DOT:
    {
        std::string shape = std::string{"shape="} + (isHighlighted_ ? "circle" : "point");
        std::string label = !label_.empty() ? ",label=" + label_ : "";
        std::string comment = !comment_.empty() ? ",xlabel=\"" + comment_ + "\"" : "";
        utility::print(os, id_, "[", shape, label, comment, "];\n");
        break;
    }

    case graphOutputFormat::WOLFRAM_NOTEBOOK:
    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }
}